

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

void setupStateFeature(FeatureDescription *feature,string *name)

{
  ulong uVar1;
  FeatureType *pFVar2;
  StateFeatureType *pSVar3;
  ArrayFeatureType *pAVar4;
  undefined8 *puVar5;
  
  uVar1 = (feature->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&feature->name_,name,puVar5);
  pFVar2 = CoreML::Specification::FeatureDescription::_internal_mutable_type(feature);
  pSVar3 = CoreML::Specification::FeatureType::_internal_mutable_statetype(pFVar2);
  pAVar4 = CoreML::Specification::StateFeatureType::_internal_mutable_arraytype(pSVar3);
  pAVar4->datatype_ = 0x10010;
  pFVar2 = CoreML::Specification::FeatureDescription::_internal_mutable_type(feature);
  pSVar3 = CoreML::Specification::FeatureType::_internal_mutable_statetype(pFVar2);
  pAVar4 = CoreML::Specification::StateFeatureType::_internal_mutable_arraytype(pSVar3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar4,1);
  return;
}

Assistant:

static void setupStateFeature(Specification::FeatureDescription *feature, const std::string& name) {
    feature->set_name(name);
    feature->mutable_type()->mutable_statetype()->mutable_arraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT16);
    feature->mutable_type()->mutable_statetype()->mutable_arraytype()->add_shape(1);
}